

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O3

void __thiscall Manifold_Decompose_Test::TestBody(Manifold_Decompose_Test *this)

{
  pointer pMVar1;
  char *message;
  pointer pMVar2;
  initializer_list<MeshSize> __l;
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  input;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> manifoldList;
  Manifold manifolds;
  Message local_190;
  vector<MeshSize,_std::allocator<MeshSize>_> local_188;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> local_168;
  AssertHelper local_150;
  vector local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_110;
  pointer local_108;
  pointer pfStack_100;
  pointer local_f8;
  pointer puStack_f0;
  
  local_168.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manifold::Manifold::Tetrahedron();
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::
  emplace_back<manifold::Manifold>(&local_168,(Manifold *)local_118);
  manifold::Manifold::~Manifold((Manifold *)local_118);
  local_138 = 0x3ff0000000000000;
  uStack_130 = 0x3ff0000000000000;
  local_128 = 0x3ff0000000000000;
  manifold::Manifold::Cube(local_118,0);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::
  emplace_back<manifold::Manifold>(&local_168,(Manifold *)local_118);
  manifold::Manifold::~Manifold((Manifold *)local_118);
  manifold::Manifold::Sphere(1.0,(int)local_118);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::
  emplace_back<manifold::Manifold>(&local_168,(Manifold *)local_118);
  manifold::Manifold::~Manifold((Manifold *)local_118);
  manifold::Manifold::Compose(local_148);
  local_f8 = (pointer)0x400000004;
  puStack_f0 = (pointer)0x400000000;
  local_108 = (pointer)0x800000006;
  pfStack_100 = (pointer)0x600000000;
  local_118 = (undefined1  [8])0xc00000008;
  pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x800000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_118;
  std::vector<MeshSize,_std::allocator<MeshSize>_>::vector
            (&local_188,__l,(allocator_type *)&local_190);
  ExpectMeshes((Manifold *)local_148,&local_188);
  if (local_188.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pMVar1 = local_168.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_188.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<MeshSize,_std::allocator<MeshSize>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_168.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_168.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar2 = local_168.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_190.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = manifold::Manifold::OriginalID();
      local_150.data_._0_4_ = 0;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)local_118,"manifold.OriginalID()","0",(int *)&local_190,
                 (int *)&local_150);
      if (local_118[0] == (Manifold)0x0) {
        testing::Message::Message(&local_190);
        message = "";
        if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          message = (pbStack_110->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                   ,0xdf,message);
        testing::internal::AssertHelper::operator=(&local_150,&local_190);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if ((long *)CONCAT44(local_190.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             local_190.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_190.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_190.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) + 8))();
        }
      }
      if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_110,pbStack_110);
      }
      manifold::Manifold::GetMeshGL((int)(MeshGLP<float,_unsigned_int> *)local_118);
      std::
      vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
      ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
                ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
                  *)&local_188,(MeshGLP<float,_unsigned_int> *)local_118);
      manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_118);
      pMVar2 = pMVar2 + 0x10;
    } while (pMVar2 != pMVar1);
  }
  RelatedGL((Manifold *)local_148,
            (vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
             *)&local_188,false,false);
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::~vector((vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
             *)&local_188);
  manifold::Manifold::~Manifold((Manifold *)local_148);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&local_168);
  return;
}

Assistant:

TEST(Manifold, ValidInput) {
  MeshGL tetGL = TetGL();
  Manifold tet(tetGL);
  EXPECT_FALSE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::NoError);
}